

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O0

ShaderMacroArray Diligent::GetShaderTypeMacros(SHADER_TYPE Type)

{
  Char *pCVar1;
  ShaderMacroArray SVar2;
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  undefined1 auStack_18 [4];
  SHADER_TYPE Type_local;
  undefined4 local_10;
  
  msg.field_2._12_4_ = Type;
  if (Type == SHADER_TYPE_VERTEX) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::VSMacros,1);
  }
  else if (Type == SHADER_TYPE_PIXEL) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::PSMacros,2);
  }
  else if (Type == SHADER_TYPE_GEOMETRY) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::GSMacros,1);
  }
  else if (Type == SHADER_TYPE_HULL) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::HSMacros,2);
  }
  else if (Type == SHADER_TYPE_DOMAIN) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::DSMacros,2);
  }
  else if (Type == SHADER_TYPE_COMPUTE) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::CSMacros,1);
  }
  else if (Type == SHADER_TYPE_AMPLIFICATION) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::ASMacros,2);
  }
  else if (Type == SHADER_TYPE_MESH) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::MSMacros,1);
  }
  else if (Type == SHADER_TYPE_RAY_GEN) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::RGMacros,1);
  }
  else if (Type == SHADER_TYPE_RAY_MISS) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::RMMacros,1);
  }
  else if (Type == SHADER_TYPE_RAY_CLOSEST_HIT) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::RCHMacros,1);
  }
  else if (Type == SHADER_TYPE_RAY_ANY_HIT) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::RAHMacros,1);
  }
  else if (Type == SHADER_TYPE_RAY_INTERSECTION) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::RIMacros,1);
  }
  else if (Type == SHADER_TYPE_CALLABLE) {
    ShaderMacroArray::ShaderMacroArray
              ((ShaderMacroArray *)auStack_18,(ShaderMacro *)(anonymous_namespace)::RCMacros,1);
  }
  else if (Type == SHADER_TYPE_LAST) {
    FormatString<char[24]>((string *)local_40,(char (*) [24])"Unsupported shader type");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetShaderTypeMacros",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
               ,0x59);
    std::__cxx11::string::~string((string *)local_40);
    ShaderMacroArray::ShaderMacroArray((ShaderMacroArray *)auStack_18);
  }
  else {
    FormatString<char[23]>((string *)local_70,(char (*) [23])"Unexpected shader type");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetShaderTypeMacros",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
               ,0x5c);
    std::__cxx11::string::~string((string *)local_70);
    ShaderMacroArray::ShaderMacroArray((ShaderMacroArray *)auStack_18);
  }
  SVar2._12_4_ = 0;
  SVar2.Elements = (ShaderMacro *)_auStack_18;
  SVar2.Count = local_10;
  return SVar2;
}

Assistant:

ShaderMacroArray GetShaderTypeMacros(SHADER_TYPE Type)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    switch (Type)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           return SHADER_MACROS_ARRAY(VSMacros);
        case SHADER_TYPE_PIXEL:            return SHADER_MACROS_ARRAY(PSMacros);
        case SHADER_TYPE_GEOMETRY:         return SHADER_MACROS_ARRAY(GSMacros);
        case SHADER_TYPE_HULL:             return SHADER_MACROS_ARRAY(HSMacros);
        case SHADER_TYPE_DOMAIN:           return SHADER_MACROS_ARRAY(DSMacros);
        case SHADER_TYPE_COMPUTE:          return SHADER_MACROS_ARRAY(CSMacros);
        case SHADER_TYPE_AMPLIFICATION:    return SHADER_MACROS_ARRAY(ASMacros);
        case SHADER_TYPE_MESH:             return SHADER_MACROS_ARRAY(MSMacros);
        case SHADER_TYPE_RAY_GEN:          return SHADER_MACROS_ARRAY(RGMacros);
        case SHADER_TYPE_RAY_MISS:         return SHADER_MACROS_ARRAY(RMMacros);
        case SHADER_TYPE_RAY_CLOSEST_HIT:  return SHADER_MACROS_ARRAY(RCHMacros);
        case SHADER_TYPE_RAY_ANY_HIT:      return SHADER_MACROS_ARRAY(RAHMacros);
        case SHADER_TYPE_RAY_INTERSECTION: return SHADER_MACROS_ARRAY(RIMacros);
        case SHADER_TYPE_CALLABLE:         return SHADER_MACROS_ARRAY(RCMacros);
        // clang-format on
        case SHADER_TYPE_TILE:
            UNEXPECTED("Unsupported shader type");
            return ShaderMacroArray{};
        default:
            UNEXPECTED("Unexpected shader type");
            return ShaderMacroArray{};
    }
}